

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O3

void __thiscall Js::CompoundString::AppendChars<int,Js::__4>(CompoundString *this,uint *value)

{
  code *pcVar1;
  bool bVar2;
  CharCount CVar3;
  CharCount CVar4;
  uint uVar5;
  charcount_t cVar6;
  errno_t eVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  size_t sVar10;
  char16_t *pcVar11;
  uint uVar12;
  char16_t *string;
  undefined1 auVar13 [16];
  char16_t local_68 [4];
  char16 localConvertBuffer [21];
  
  pcVar8 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar8 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ed,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00b3c407;
    *puVar9 = 0;
  }
  bVar2 = OwnsLastBlock(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ee,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00b3c407;
    *puVar9 = 0;
  }
  bVar2 = HasOnlyDirectChars(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ef,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) goto LAB_00b3c407;
    *puVar9 = 0;
  }
  CVar3 = LastBlockCharLength(this);
  CVar4 = LastBlockCharCapacity(this);
  if (CVar4 - CVar3 < 0xb) {
    string = local_68;
  }
  else {
    pcVar8 = LastBlockChars(this);
    string = pcVar8 + CVar3;
  }
  uVar12 = *value;
  if ((ulong)uVar12 < 10) {
    string[0] = L'0';
    string[1] = L'0';
    string[2] = L'0';
LAB_00b3c1d8:
    string[3] = (ushort)uVar12 | 0x30;
LAB_00b3c22c:
    string[4] = L'\0';
  }
  else {
    if (uVar12 < 100) {
      uVar5 = (uVar12 & 0xff) / 10;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (ulong)uVar5 | (ulong)(byte)((char)uVar12 + (char)uVar5 * -10) << 8;
      string[0] = L'0';
      string[1] = L'0';
      auVar13 = pmovzxbw(auVar13 | _DAT_01129680,auVar13 | _DAT_01129680);
      *(int *)(string + 2) = auVar13._0_4_;
      goto LAB_00b3c22c;
    }
    if (uVar12 < 1000) {
      *string = L'0';
      string[1] = (ushort)((uVar12 & 0xffff) / 100) | 0x30;
      uVar5 = (uVar12 & 0xffff) / 10;
      string[2] = (ushort)(byte)((char)uVar5 + ((byte)((uVar5 & 0xff) / 5) & 0xfe) * -5 | 0x30);
      uVar12 = uVar12 + uVar5 * -10;
      goto LAB_00b3c1d8;
    }
    eVar7 = _ultow_s((ulong)uVar12,(char16_t_conflict *)string,0xb,10);
    if (eVar7 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/DateImplementation.h"
                                  ,0x180,"(err == 0)","err == 0");
      if (!bVar2) goto LAB_00b3c407;
      *puVar9 = 0;
    }
  }
  sVar10 = PAL_wcslen(string);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,StringConcatPhase);
  uVar12 = (uint)sVar10;
  if (bVar2) {
    pcVar11 = L"";
    if (8 < uVar12) {
      pcVar11 = L"...";
    }
    Output::Print(L"CompoundString::AppendGeneric(TValue &, appendChars = %s) - converted = \"%.8s%s\", appendCharLength = %u\n"
                  ,L"true",string,pcVar11,sVar10 & 0xffffffff);
    Output::Flush();
  }
  if (CVar4 - CVar3 < 0xb) {
    if (string != local_68) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                  ,0x50c,"(convertBuffer == localConvertBuffer)",
                                  "convertBuffer == localConvertBuffer");
      if (!bVar2) {
LAB_00b3c407:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar9 = 0;
    }
    AppendGeneric<Js::CompoundString>(local_68,uVar12,this,true);
  }
  else {
    cVar6 = JavascriptString::GetLength((JavascriptString *)this);
    JavascriptString::SetLength((JavascriptString *)this,cVar6 + uVar12);
    SetLastBlockCharLength(this,CVar3 + uVar12);
  }
  return;
}

Assistant:

inline void CompoundString::AppendChars(
        const TValue &value,
        const CharCount maximumAppendCharLength,
        const FConvertToString ConvertToString)
    {
        AppendGeneric(value, maximumAppendCharLength, ConvertToString, this, true);
    }